

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_4,_2> * __thiscall
tcu::transpose<float,2,4>
          (Matrix<float,_4,_2> *__return_storage_ptr__,tcu *this,Matrix<float,_2,_4> *mat)

{
  int col;
  int row;
  long lVar1;
  Vector<float,_4> *pVVar2;
  long lVar3;
  
  Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<float,_4> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      ((Vector<tcu::Vector<float,_4>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar3] =
           *(float *)(this + lVar3 * 8);
    }
    pVVar2 = pVVar2 + 1;
    this = this + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}